

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O0

bool __thiscall GCSFilter::MatchAny(GCSFilter *this,ElementSet *elements)

{
  bool bVar1;
  size_t in_RSI;
  uint64_t *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_long,_std::allocator<unsigned_long>_> queries;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  GCSFilter *in_stack_ffffffffffffffe0;
  ElementSet *in_stack_fffffffffffffff0;
  GCSFilter *this_01;
  
  this_01 = *(GCSFilter **)(in_FS_OFFSET + 0x28);
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffe0;
  BuildHashedSet(this_01,in_stack_fffffffffffffff0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data(in_stack_ffffffffffffff98);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_stack_ffffffffffffff98);
  bVar1 = MatchInternal(in_stack_ffffffffffffffe0,in_RDI,in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_00);
  if (*(GCSFilter **)(in_FS_OFFSET + 0x28) == this_01) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool GCSFilter::MatchAny(const ElementSet& elements) const
{
    const std::vector<uint64_t> queries = BuildHashedSet(elements);
    return MatchInternal(queries.data(), queries.size());
}